

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::resume(session_impl *this)

{
  bool bVar1;
  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  shared_ptr<libtorrent::aux::torrent> *te;
  iterator __end2;
  iterator __begin2;
  torrent_list<libtorrent::aux::torrent> *__range2;
  session_impl *this_local;
  
  if ((this->m_paused & 1U) != 0) {
    this->m_paused = false;
    __end2 = torrent_list<libtorrent::aux::torrent>::begin(&this->m_torrents);
    te = (shared_ptr<libtorrent::aux::torrent> *)
         torrent_list<libtorrent::aux::torrent>::end(&this->m_torrents);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                                       *)&te), bVar1) {
      this_00 = (__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                   ::operator*(&__end2);
      this_01 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(this_00);
      torrent::set_session_paused(this_01,false);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void session_impl::resume()
	{
		TORRENT_ASSERT(is_single_thread());

		if (!m_paused) return;
		m_paused = false;

		for (auto& te : m_torrents)
		{
			te->set_session_paused(false);
		}
	}